

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

uint __thiscall Js::WebAssemblyModule::GetGlobalsByteSize(WebAssemblyModule *this)

{
  bool bVar1;
  undefined4 local_18;
  undefined4 local_14;
  WasmType type;
  uint32 size;
  WebAssemblyModule *this_local;
  
  local_14 = 0;
  for (local_18 = FirstLocalType; (int)local_18 < 6; local_18 = local_18 + FirstLocalType) {
    bVar1 = Wasm::WasmTypes::IsLocalType(local_18);
    if (bVar1) {
      local_14 = AddGlobalByteSizeToOffset(this,local_18,local_14);
    }
  }
  return local_14;
}

Assistant:

uint
WebAssemblyModule::GetGlobalsByteSize() const
{
    uint32 size = 0;
    for (Wasm::WasmTypes::WasmType type = (Wasm::WasmTypes::WasmType)(Wasm::WasmTypes::Void + 1); type < Wasm::WasmTypes::Limit; type = (Wasm::WasmTypes::WasmType)(type + 1))
    {
        if (!Wasm::WasmTypes::IsLocalType(type))
        {
            continue;
        }
        size = AddGlobalByteSizeToOffset(type, size);
    }
    return size;
}